

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveHyper(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *feastol)

{
  fpclass_type fVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  int32_t iVar6;
  int *piVar5;
  int32_t iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined4 *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  pointer pnVar14;
  uint *puVar15;
  pointer pnVar16;
  devexpr *pdVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  long lVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_55c;
  undefined1 local_538 [32];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [13];
  undefined3 uStack_4cb;
  int iStack_4c8;
  bool bStack_4c4;
  undefined8 local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b8;
  cpp_dec_float<200U,_int,_void> local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  devexpr local_330 [112];
  int local_2c0;
  undefined1 local_2bc;
  fpclass_type local_2b8;
  int32_t local_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar21 = 0;
  local_4c0._0_4_ = cpp_dec_float_finite;
  local_4c0._4_4_ = 0x1c;
  local_538._0_16_ = (undefined1  [16])0x0;
  local_538._16_16_ = (undefined1  [16])0x0;
  local_518 = (undefined1  [16])0x0;
  local_508 = (undefined1  [16])0x0;
  local_4f8 = (undefined1  [16])0x0;
  local_4e8 = (undefined1  [16])0x0;
  local_4d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_4cb = 0;
  iStack_4c8 = 0;
  bStack_4c4 = false;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_430,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  lVar20 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar20 < 1) {
    local_55c = -1;
  }
  else {
    lVar20 = lVar20 + 1;
    local_55c = -1;
    do {
      iVar9 = (this->bestPrices).super_IdxSet.idx[lVar20 + -2];
      pnVar14 = pnVar3 + iVar9;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_538;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
      }
      iStack_4c8 = pnVar3[iVar9].m_backend.exp;
      bStack_4c4 = pnVar3[iVar9].m_backend.neg;
      local_4c0._0_4_ = pnVar3[iVar9].m_backend.fpclass;
      local_4c0._4_4_ = pnVar3[iVar9].m_backend.prec_elem;
      pnVar12 = feastol;
      pcVar13 = &local_4b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_4b0.exp = (feastol->m_backend).exp;
      local_4b0.neg = (feastol->m_backend).neg;
      fVar1 = (feastol->m_backend).fpclass;
      iVar6 = (feastol->m_backend).prec_elem;
      local_4b0.fpclass = fVar1;
      local_4b0.prec_elem = iVar6;
      if (local_4b0.data._M_elems[0] != 0 || fVar1 != cpp_dec_float_finite) {
        local_4b0.neg = (bool)(local_4b0.neg ^ 1);
      }
      if (fVar1 == cpp_dec_float_NaN || (fpclass_type)local_4c0 == cpp_dec_float_NaN) {
LAB_005aa3e8:
        piVar5 = (this->bestPrices).super_IdxSet.idx;
        iVar8 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar8 + -1;
        piVar5[lVar20 + -2] = piVar5[(long)iVar8 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar9] = 0;
      }
      else {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_538,&local_4b0);
        if (-1 < iVar8) goto LAB_005aa3e8;
        puVar11 = (undefined4 *)local_538;
        pdVar17 = local_b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined4 *)pdVar17 = *puVar11;
          puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
          pdVar17 = pdVar17 + (ulong)bVar21 * -8 + 4;
        }
        local_40 = iStack_4c8;
        local_3c = bStack_4c4;
        local_38 = (fpclass_type)local_4c0;
        iStack_34 = local_4c0._4_4_;
        pnVar14 = pnVar4 + iVar9;
        pnVar16 = pnVar14;
        pnVar12 = &local_130;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar4[iVar9].m_backend.exp;
        local_130.m_backend.neg = pnVar4[iVar9].m_backend.neg;
        local_130.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
        pnVar12 = feastol;
        pnVar18 = &local_1b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4b0,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pcVar13 = &local_4b0;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_538;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar19->data)._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4)
          ;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar21 * -8 + 4);
        }
        iStack_4c8 = local_4b0.exp;
        bStack_4c4 = local_4b0.neg;
        local_4c0._0_4_ = local_4b0.fpclass;
        local_4c0._4_4_ = local_4b0.prec_elem;
        if ((local_4b0.fpclass != cpp_dec_float_NaN) && (local_430.fpclass != cpp_dec_float_NaN)) {
          iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_538,&local_430);
          if (0 < iVar8) {
            puVar15 = (uint *)local_538;
            pcVar13 = &local_430;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar13->data)._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_430.exp = iStack_4c8;
            local_430.neg = bStack_4c4;
            local_430.fpclass = (fpclass_type)local_4c0;
            local_430.prec_elem = local_4c0._4_4_;
            pnVar16 = pnVar14;
            pnVar12 = &this->last;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
              pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
            }
            (this->last).m_backend.exp = (pnVar14->m_backend).exp;
            (this->last).m_backend.neg = (pnVar14->m_backend).neg;
            iVar7 = (pnVar14->m_backend).prec_elem;
            (this->last).m_backend.fpclass = (pnVar14->m_backend).fpclass;
            (this->last).m_backend.prec_elem = iVar7;
            local_55c = iVar9;
          }
        }
        if ((((fpclass_type)local_4c0 == cpp_dec_float_NaN) ||
            (local_3b0.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_538,&local_3b0), -1 < iVar9))
        {
          if (local_3b0.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_4b0,0,(type *)0x0);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3b0,&local_4b0);
            if (iVar9 < 0) goto LAB_005aa663;
          }
        }
        else {
LAB_005aa663:
          puVar15 = (uint *)local_538;
          pcVar13 = &local_3b0;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar13->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_3b0.exp = iStack_4c8;
          local_3b0.neg = bStack_4c4;
          local_3b0.fpclass = (fpclass_type)local_4c0;
          local_3b0.prec_elem = local_4c0._4_4_;
        }
      }
      lVar20 = lVar20 + -1;
    } while (1 < lVar20);
  }
  lVar20 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViols).super_IdxSet.num;
  if (0 < lVar20) {
    local_4b8 = &this->last;
    lVar20 = lVar20 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar9 = (pSVar2->updateViols).super_IdxSet.idx[lVar20 + -2];
      if ((pSVar2->isInfeasible).data[iVar9] == 1) {
        pnVar14 = pnVar3 + iVar9;
        puVar15 = (uint *)local_538;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar15 = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
        }
        iStack_4c8 = pnVar3[iVar9].m_backend.exp;
        bStack_4c4 = pnVar3[iVar9].m_backend.neg;
        local_4c0._0_4_ = pnVar3[iVar9].m_backend.fpclass;
        local_4c0._4_4_ = pnVar3[iVar9].m_backend.prec_elem;
        puVar15 = (uint *)local_538;
        pdVar17 = local_330;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(uint *)pdVar17 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
          pdVar17 = pdVar17 + (ulong)bVar21 * -8 + 4;
        }
        pnVar14 = pnVar4 + iVar9;
        pnVar16 = pnVar14;
        pnVar12 = &local_230;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_230.m_backend.exp = pnVar4[iVar9].m_backend.exp;
        local_230.m_backend.neg = pnVar4[iVar9].m_backend.neg;
        local_230.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
        local_230.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
        pnVar12 = feastol;
        pnVar18 = &local_2b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_2b0.m_backend.exp = (feastol->m_backend).exp;
        local_2b0.m_backend.neg = (feastol->m_backend).neg;
        local_2b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_2b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        local_2c0 = iStack_4c8;
        local_2bc = bStack_4c4;
        local_2b8 = (fpclass_type)local_4c0;
        local_2b4 = local_4c0._4_4_;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4b0,local_330,&local_230,&local_2b0,&local_230);
        pcVar13 = &local_4b0;
        puVar15 = (uint *)local_538;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar15 = (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4)
          ;
          puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
        }
        iStack_4c8 = local_4b0.exp;
        bStack_4c4 = local_4b0.neg;
        local_4c0._0_4_ = local_4b0.fpclass;
        local_4c0._4_4_ = local_4b0.prec_elem;
        if (((local_4b0.fpclass != cpp_dec_float_NaN) && (local_3b0.fpclass != cpp_dec_float_NaN))
           && (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_538,&local_3b0), 0 < iVar8
              )) {
          if ((((fpclass_type)local_4c0 != cpp_dec_float_NaN) &&
              (local_430.fpclass != cpp_dec_float_NaN)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_538,&local_430), 0 < iVar8)
             ) {
            puVar15 = (uint *)local_538;
            pcVar13 = &local_430;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar13->data)._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_430.exp = iStack_4c8;
            local_430.neg = bStack_4c4;
            local_430.fpclass = (fpclass_type)local_4c0;
            local_430.prec_elem = local_4c0._4_4_;
            pnVar16 = pnVar14;
            pnVar12 = local_4b8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
              pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
            }
            (this->last).m_backend.exp = (pnVar14->m_backend).exp;
            (this->last).m_backend.neg = (pnVar14->m_backend).neg;
            iVar7 = (pnVar14->m_backend).prec_elem;
            (this->last).m_backend.fpclass = (pnVar14->m_backend).fpclass;
            (this->last).m_backend.prec_elem = iVar7;
            local_55c = iVar9;
          }
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->isInfeasible).data[iVar9] = 2;
          DIdxSet::addIdx(&this->bestPrices,iVar9);
        }
      }
      lVar20 = lVar20 + -1;
    } while (1 < lVar20);
  }
  return local_55c;
}

Assistant:

int SPxDevexPR<R>::selectLeaveHyper(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   R leastBest = -1;
   int bstI = -1;
   int idx = -1;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -feastol);
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bstI = idx;
               last = cpen[idx];
            }

            // put index into candidate list
            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bstI;
}